

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrainManager.hpp
# Opt level: O3

void __thiscall sjtu::TrainManager::query_transfer(TrainManager *this,int argc,string *argv)

{
  int iVar1;
  long lVar2;
  invalid_command *this_00;
  int iVar3;
  string *psVar4;
  _Alloc_hider _Var5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  long *plVar7;
  string date;
  string keyword;
  string station [2];
  undefined1 *local_118;
  long local_110;
  undefined1 local_108;
  undefined7 uStack_107;
  long *local_f8 [2];
  long local_e8 [2];
  string local_d8;
  string local_b8;
  timeType local_98;
  undefined1 local_88 [16];
  string local_78 [32];
  string local_58 [16];
  long local_48 [3];
  
  lVar2 = 0x10;
  do {
    *(string **)(local_88 + lVar2) = local_78 + lVar2;
    *(undefined8 *)(local_78 + lVar2 + -8) = 0;
    local_78[lVar2] = (string)0x0;
    lVar2 = lVar2 + 0x20;
  } while (lVar2 != 0x50);
  local_118 = &local_108;
  local_110 = 0;
  local_108 = 0;
  local_f8[0] = local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"");
  if (0 < argc) {
    iVar3 = 0;
    do {
      iVar1 = std::__cxx11::string::compare((char *)argv);
      psVar4 = local_78;
      if (iVar1 != 0) {
        iVar1 = std::__cxx11::string::compare((char *)argv);
        psVar4 = local_58;
        if (iVar1 != 0) {
          iVar1 = std::__cxx11::string::compare((char *)argv);
          psVar4 = (string *)&local_118;
          if (iVar1 != 0) {
            iVar1 = std::__cxx11::string::compare((char *)argv);
            psVar4 = (string *)local_f8;
            if (iVar1 != 0) {
              this_00 = (invalid_command *)__cxa_allocate_exception(0x68);
              invalid_command::invalid_command(this_00);
              __cxa_throw(this_00,&invalid_command::typeinfo,invalid_command::~invalid_command);
            }
          }
        }
      }
      std::__cxx11::string::_M_assign(psVar4);
      argv = argv + 2;
      iVar3 = iVar3 + 2;
    } while (iVar3 < argc);
  }
  iVar3 = std::__cxx11::string::compare((char *)local_f8);
  if (iVar3 == 0) {
    paVar6 = &local_b8.field_2;
    local_b8._M_dataplus._M_p = (pointer)paVar6;
    std::__cxx11::string::_M_construct<char*>((string *)&local_b8,local_118,local_118 + local_110);
    timeType::timeType((timeType *)local_88,&local_b8);
    query_transfer_cmp<sjtu::cmp_time>(this,local_78,local_88);
    _Var5._M_p = local_b8._M_dataplus._M_p;
  }
  else {
    paVar6 = &local_d8.field_2;
    local_d8._M_dataplus._M_p = (pointer)paVar6;
    std::__cxx11::string::_M_construct<char*>((string *)&local_d8,local_118,local_118 + local_110);
    timeType::timeType(&local_98,&local_d8);
    query_transfer_cmp<sjtu::cmp_cost>(this,local_78,&local_98);
    _Var5._M_p = local_d8._M_dataplus._M_p;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var5._M_p != paVar6) {
    operator_delete(_Var5._M_p,paVar6->_M_allocated_capacity + 1);
  }
  if (local_f8[0] != local_e8) {
    operator_delete(local_f8[0],local_e8[0] + 1);
  }
  if (local_118 != &local_108) {
    operator_delete(local_118,CONCAT71(uStack_107,local_108) + 1);
  }
  lVar2 = -0x40;
  plVar7 = local_48;
  do {
    if (plVar7 != (long *)plVar7[-2]) {
      operator_delete((long *)plVar7[-2],*plVar7 + 1);
    }
    plVar7 = plVar7 + -4;
    lVar2 = lVar2 + 0x20;
  } while (lVar2 != 0);
  return;
}

Assistant:

void query_transfer(int argc , std::string *argv)
		{
			std::string station[2] , date , keyword = "";
			for (int i = 0;i < argc;i += 2)
				if (argv[i] == "-s") station[0] = argv[i + 1];
				else if (argv[i] == "-t") station[1] = argv[i + 1];
				else if (argv[i] == "-d") date = argv[i + 1];
				else if (argv[i] == "-p") keyword = argv[i + 1];
				else throw invalid_command();
			if (keyword == "time") query_transfer_cmp(station , date , cmp_time());
			else query_transfer_cmp(station , date , cmp_cost());
		}